

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_parse(cargo_t ctx,cargo_flags_t flags,int start_index,int argc,char **argv)

{
  int iVar1;
  cargo_parse_result_t cVar2;
  char **ppcVar3;
  int *piVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  int unknown_ret;
  char *combined;
  size_t i;
  int is_combined;
  int is_positional;
  size_t opt_i;
  cargo_opt_t *pcStack_58;
  cargo_flags_t global_flags;
  cargo_opt_t *opt;
  char *name;
  char *arg;
  int local_38;
  int opt_arg_count;
  int start;
  int ret;
  char **argv_local;
  int local_20;
  int argc_local;
  int start_index_local;
  cargo_flags_t flags_local;
  cargo_t ctx_local;
  
  opt_arg_count = 0;
  local_38 = 0;
  arg._4_4_ = CARGO_PARSE_OK;
  name = (char *)0x0;
  opt = (cargo_opt_t *)0x0;
  pcStack_58 = (cargo_opt_t *)0x0;
  opt_i._4_4_ = ctx->flags;
  _start = argv;
  argv_local._4_4_ = argc;
  local_20 = start_index;
  argc_local = flags;
  _start_index_local = ctx;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x13f3,"int cargo_parse(cargo_t, cargo_flags_t, int, int, char **)");
  }
  if (flags != 0) {
    ctx->flags = flags;
  }
  ctx->argc = argc;
  ctx->argv = argv;
  ctx->start = start_index;
  ctx->stopped = 0;
  ctx->stopped_hard = 0;
  _cargo_set_error(ctx,(char *)0x0);
  _cargo_add_help_if_missing(_start_index_local);
  _cargo_add_orphans_to_default_group(_start_index_local);
  _cargo_free_str_list(&_start_index_local->args,(size_t *)0x0);
  _start_index_local->arg_count = 0;
  _cargo_free_str_list(&_start_index_local->unknown_opts,(size_t *)0x0);
  _cargo_xfree(&_start_index_local->unknown_opts_idxs);
  _start_index_local->unknown_opts_count = 0;
  _cargo_cleanup_option_values(_start_index_local,0);
  ppcVar3 = (char **)_cargo_calloc((long)argv_local._4_4_,8);
  _start_index_local->args = ppcVar3;
  if (ppcVar3 == (char **)0x0) {
    opt_arg_count = -2;
    cVar2 = opt_arg_count;
  }
  else {
    ppcVar3 = (char **)_cargo_calloc((long)argv_local._4_4_,8);
    _start_index_local->unknown_opts = ppcVar3;
    if (ppcVar3 == (char **)0x0) {
      opt_arg_count = -2;
      cVar2 = opt_arg_count;
    }
    else {
      piVar4 = (int *)_cargo_calloc((long)argv_local._4_4_,4);
      _start_index_local->unknown_opts_idxs = piVar4;
      if (piVar4 == (int *)0x0) {
        opt_arg_count = -2;
        cVar2 = opt_arg_count;
      }
      else if ((((_start_index_local->flags & CARGO_SKIP_CHECK_UNKNOWN) == 0) &&
               ((_start_index_local->flags & CARGO_UNKNOWN_EARLY) != 0)) &&
              (cVar2 = _cargo_check_unknown_options(_start_index_local), cVar2 != CARGO_PARSE_OK)) {
        opt_arg_count = -1;
        cVar2 = opt_arg_count;
      }
      else {
        _start_index_local->i = _start_index_local->start;
        while (_start_index_local->i < _start_index_local->argc) {
          name = _start[_start_index_local->i];
          local_38 = _start_index_local->i;
          arg._4_4_ = CARGO_PARSE_OK;
          if (_start_index_local->stopped == 0) {
            _is_combined = 0;
            bVar7 = false;
            bVar6 = false;
            opt = (cargo_opt_t *)
                  _cargo_find_full_option(_start_index_local,&stack0xffffffffffffffa8,name);
            if (opt == (cargo_opt_t *)0x0) {
              pcVar5 = _cargo_is_arg_combined_option(_start_index_local,name);
              bVar6 = pcVar5 != (char *)0x0;
              if (bVar6) {
                for (combined = (char *)0x1; pcVar5 = (char *)strlen(name), combined < pcVar5;
                    combined = combined + 1) {
                  pcVar5 = _cargo_find_short_option
                                     (_start_index_local,&stack0xffffffffffffffa8,
                                      name[(long)combined]);
                  if (pcVar5 == (char *)0x0) {
                    __assert_fail("combined != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                                  ,0x1456,
                                  "int cargo_parse(cargo_t, cargo_flags_t, int, int, char **)");
                  }
                  arg._4_4_ = _cargo_parse_option(_start_index_local,pcStack_58,pcVar5,
                                                  argv_local._4_4_,_start);
                  cVar2 = arg._4_4_;
                  if (arg._4_4_ < CARGO_PARSE_OK) goto LAB_00106ba9;
                }
              }
              else {
                iVar1 = _cargo_get_positional(_start_index_local,(size_t *)&is_combined);
                bVar7 = iVar1 == 0;
                pcStack_58 = _start_index_local->options + _is_combined;
              }
            }
            if ((opt != (cargo_opt_t *)0x0) || (bVar7)) {
              arg._4_4_ = _cargo_parse_option(_start_index_local,pcStack_58,(char *)opt,
                                              argv_local._4_4_,_start);
              cVar2 = arg._4_4_;
              if (arg._4_4_ < CARGO_PARSE_OK) goto LAB_00106ba9;
            }
            else if (!bVar6) {
              arg._4_4_ = _cargo_add_extra_arg(_start_index_local);
            }
          }
          else {
            arg._4_4_ = _cargo_add_extra_arg(_start_index_local);
          }
          if (arg._4_4_ == CARGO_PARSE_OK) {
            arg._4_4_ = CARGO_PARSE_SHOW_HELP;
          }
          _start_index_local->i = arg._4_4_ + _start_index_local->i;
        }
        if (_start_index_local->help != 0) {
          cargo_print_usage(_start_index_local,CARGO_USAGE_FULL);
          _start_index_local->flags = opt_i._4_4_;
          return 1;
        }
        if (_start_index_local->stopped_hard != 0) {
LAB_00106b96:
          _start_index_local->flags = opt_i._4_4_;
          return 0;
        }
        if (((_start_index_local->flags & CARGO_SKIP_CHECK_REQUIRED) == 0) &&
           (iVar1 = _cargo_check_required_options(_start_index_local), iVar1 != 0)) {
          opt_arg_count = -4;
          cVar2 = opt_arg_count;
        }
        else if ((((_start_index_local->flags & CARGO_SKIP_CHECK_MUTEX) != 0) ||
                 (opt_arg_count = _cargo_check_mutex_groups(_start_index_local),
                 cVar2 = opt_arg_count, opt_arg_count == CARGO_PARSE_OK)) &&
                (((_start_index_local->flags & CARGO_SKIP_CHECK_UNKNOWN) != 0 ||
                 (opt_arg_count = _cargo_check_unknown_options_after(_start_index_local),
                 cVar2 = opt_arg_count, opt_arg_count == CARGO_PARSE_OK)))) {
          if ((_start_index_local->flags & CARGO_NOWARN) == 0) {
            _cargo_parse_show_error(_start_index_local);
          }
          goto LAB_00106b96;
        }
      }
    }
  }
LAB_00106ba9:
  opt_arg_count = cVar2;
  if (((_start_index_local->unknown_opts_count == 0) &&
      ((_start_index_local->flags & CARGO_SKIP_CHECK_UNKNOWN) == 0)) &&
     (cVar2 = _cargo_check_unknown_options_after(_start_index_local), cVar2 != CARGO_PARSE_OK)) {
    opt_arg_count = cVar2;
  }
  _cargo_parse_show_error(_start_index_local);
  _cargo_cleanup_option_values(_start_index_local,1);
  _start_index_local->flags = opt_i._4_4_;
  return opt_arg_count;
}

Assistant:

int cargo_parse(cargo_t ctx, cargo_flags_t flags, int start_index, int argc, char **argv)
{
    int ret = CARGO_PARSE_OK;
    int start = 0;
    int opt_arg_count = 0;
    char *arg = NULL;
    const char *name = NULL;
    cargo_opt_t *opt = NULL;
    cargo_flags_t global_flags = ctx->flags;
    assert(ctx);

    // Override if any flags are set.
    if (flags)
    {
        ctx->flags = flags;
    }

    CARGODBG(2, "============ Cargo Parse =============\n");

    ctx->argc = argc;
    ctx->argv = argv;
    ctx->start = start_index;
    ctx->stopped = 0;
    ctx->stopped_hard = 0;

    _cargo_set_error(ctx, NULL);

    _cargo_add_help_if_missing(ctx);
    _cargo_add_orphans_to_default_group(ctx);

    _cargo_free_str_list(&ctx->args, NULL);
    ctx->arg_count = 0;

    _cargo_free_str_list(&ctx->unknown_opts, NULL);
    _cargo_xfree(&ctx->unknown_opts_idxs);
    ctx->unknown_opts_count = 0;

    // Make sure we start over, if this function is
    // called more than once.
    // (But we don't free the values since we don't want to
    //  overwrite default or already parsed values)
    _cargo_cleanup_option_values(ctx, 0);

    // TODO: Handle the case when argc == 0 (this will fail then).
    if (!(ctx->args = (char **)_cargo_calloc(argc, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory!\n");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    if (!(ctx->unknown_opts = (char **)_cargo_calloc(argc, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory!\n");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    if (!(ctx->unknown_opts_idxs = _cargo_calloc(argc, sizeof(int))))
    {
        CARGODBG(1, "Out of memory");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    CARGODBG(2, "Parse arg list of count %d start at index %d\n", argc, start_index);

    // Check for unknown options early.
    if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
        && (ctx->flags & CARGO_UNKNOWN_EARLY)
        && _cargo_check_unknown_options(ctx))
    {
        ret = CARGO_PARSE_UNKNOWN_OPTS; goto fail;
    }

    for (ctx->i = ctx->start; ctx->i < ctx->argc; )
    {
        arg = argv[ctx->i];
        start = ctx->i;
        opt_arg_count = 0;

        CARGODBG(3, "\n");
        CARGODBG(3, "argv[%d] = %s\n", ctx->i, arg);
        CARGODBG(3, "  Look for opt matching %s:\n", arg);

        // TODO: Add support for a "--" option which forces all
        // options specified after it to be parsed as positional arguments
        // and not options. Say there's a file named "-thefile".

        // TODO: Add support for abbreviated prefix matching so that
        // --ar will match --arne unless it's ambigous with some other option.
        if (!ctx->stopped)
        {
            size_t opt_i = 0;
            int is_positional = 0;
            int is_combined = 0;

            // Look for options "--myoption 1 2 3"
            if (!(name = _cargo_find_full_option(ctx, &opt, arg)))
            {
                // Is this a set of combined short options?
                // -a -b -c -> -abc
                if ((is_combined = (_cargo_is_arg_combined_option(ctx, arg) != NULL)))
                {
                    size_t i;
                    const char *combined = NULL;

                    // Skip '-' by starting at 1.
                    for (i = 1; i < strlen(arg); i++)
                    {
                        combined = _cargo_find_short_option(ctx, &opt, arg[i]);
                        assert(combined != NULL);

                        if ((opt_arg_count = _cargo_parse_option(ctx, opt, combined,
                                                                argc, argv)) < 0)
                        {
                            CARGODBG(1, "Failed to parse %s option: %s\n",
                                    _cargo_type_to_str(opt->type), opt->name[0]);
                            ret = opt_arg_count; goto fail;
                        }
                    }
                }
                else
                {
                    // Or a positional argument "1 2 3"
                    // (just an argument that is parsed into a specific options target)
                    is_positional = !_cargo_get_positional(ctx, &opt_i);
                    opt = &ctx->options[opt_i];
                    CARGODBG(2, "    Positional argument: %s\n", argv[ctx->i]);
                }
            }

            if (name || is_positional)
            {
                // We found an option, parse any arguments it might have.
                if ((opt_arg_count = _cargo_parse_option(ctx, opt, name,
                                                        argc, argv)) < 0)
                {
                    CARGODBG(1, "Failed to parse %s option: %s\n",
                            _cargo_type_to_str(opt->type), opt->name[0]);
                    ret = opt_arg_count; goto fail;
                }
            }
            else if (!is_combined)
            {
                // A leftover argument that no option wants.
                opt_arg_count = _cargo_add_extra_arg(ctx);
            }
        }
        else
        {
            // Stopped parsing, so everything is saved as extra arguments.
            opt_arg_count = _cargo_add_extra_arg(ctx);
        }

        if (opt_arg_count == 0)
            opt_arg_count = 1;

        CARGODBG(3, "opt_arg_count == %d\n", opt_arg_count);

        ctx->i += opt_arg_count;

        #if CARGO_DEBUG
        _cargo_debug_print_eaten_args(ctx, start, opt_arg_count);
        #endif // CARGO_DEBUG
    }

    // Print automatic help.
    if (ctx->help)
    {
        cargo_print_usage(ctx, 0);
        ctx->flags = global_flags;
        return CARGO_PARSE_SHOW_HELP;
    }

    // An option can cause a "hard stop", meaning that there
    // won't be any errors for mutex groups and so on. This is
    // useful for cases where you have --advanced_help or similar
    // where you just want to show some extended help without also
    // having to specify required arguments.
    if (ctx->stopped_hard)
    {
        goto skip_checks;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_REQUIRED)
        && _cargo_check_required_options(ctx))
    {
        ret = CARGO_PARSE_MISS_REQUIRED; goto fail;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_MUTEX)
        && (ret = _cargo_check_mutex_groups(ctx)))
    {
        goto fail;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
        && (ret = _cargo_check_unknown_options_after(ctx)))
    {
        goto fail;
    }

    // Shows warnings.
    if (!(ctx->flags & CARGO_NOWARN))
    {
        _cargo_parse_show_error(ctx);
    }

skip_checks:
    ctx->flags = global_flags;
    return CARGO_PARSE_OK;

fail:
    // Let unknown options override other errors.
    // But don't check for them more than once.
    if (ctx->unknown_opts_count == 0)
    {
        int unknown_ret = 0;
        if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
            && (unknown_ret = _cargo_check_unknown_options_after(ctx)))
        {
            CARGODBG(1, "Unknown option overrides previous error\n");
            ret = unknown_ret;
        }
    }

    _cargo_parse_show_error(ctx);
    _cargo_cleanup_option_values(ctx, 1);
    ctx->flags = global_flags;
    return ret;
}